

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atexit.c
# Opt level: O2

int dumb_atexit(_func_void *proc)

{
  DUMB_ATEXIT_PROC **ppDVar1;
  DUMB_ATEXIT_PROC *pDVar2;
  
  ppDVar1 = &dumb_atexit_proc;
  do {
    ppDVar1 = &((DUMB_ATEXIT_PROC *)ppDVar1)->next->next;
    if ((DUMB_ATEXIT_PROC *)ppDVar1 == (DUMB_ATEXIT_PROC *)0x0) {
      pDVar2 = (DUMB_ATEXIT_PROC *)malloc(0x10);
      if (pDVar2 != (DUMB_ATEXIT_PROC *)0x0) {
        pDVar2->next = dumb_atexit_proc;
        pDVar2->proc = proc;
        dumb_atexit_proc = pDVar2;
        return 0;
      }
      return -1;
    }
  } while (((DUMB_ATEXIT_PROC *)ppDVar1)->proc != proc);
  return 0;
}

Assistant:

int dumb_atexit(void (*proc)(void))
{
	DUMB_ATEXIT_PROC *dap = dumb_atexit_proc;

	while (dap) {
		if (dap->proc == proc) return 0;
		dap = dap->next;
	}

	dap = malloc(sizeof(*dap));

	if (!dap)
		return -1;

	dap->next = dumb_atexit_proc;
	dap->proc = proc;
	dumb_atexit_proc = dap;

	return 0;
}